

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poll.cpp
# Opt level: O0

int __thiscall Poller::Process(Poller *this)

{
  uint uVar1;
  long *plVar2;
  int iVar3;
  epoll_event *peVar4;
  PollObj *po;
  uint32_t what;
  epoll_event *event;
  int i;
  int fds;
  Poller *this_local;
  
  iVar3 = epoll_wait(this->context->epollfd,(epoll_event *)this->context->events,
                     this->context->nevents,this->context->timeout);
  for (event._0_4_ = 0; (int)event < iVar3; event._0_4_ = (int)event + 1) {
    peVar4 = this->context->events + (int)event;
    uVar1 = peVar4->events;
    plVar2 = (long *)(peVar4->data).ptr;
    if ((uVar1 & 0x18) == 0) {
      if ((uVar1 & 1) != 0) {
        (**(code **)(*plVar2 + 0x18))();
      }
      if ((uVar1 & 4) != 0) {
        (**(code **)(*plVar2 + 0x20))();
      }
    }
    else {
      (**(code **)(*plVar2 + 0x28))();
    }
  }
  return 0;
}

Assistant:

int Poller::Process() {
    int fds = epoll_wait(context->epollfd, context->events, context->nevents, context->timeout);
    for(int i = 0; i < fds; ++i) {
        auto& event = context->events[i];
        auto what = event.events;
        auto* po = (PollObj*)(event.data.ptr);
        if (what & (EPOLLHUP | EPOLLERR)) {
            po->OnError();
        }
        else {
            if(what & EPOLLIN)
                po->OnData();
            if(what & EPOLLOUT)
                po->OnWrite();
        }
    }
    return 0;
}